

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall CEngine::StartLogging(CEngine *this,IOHANDLE DataLogSent,IOHANDLE DataLogRecv)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  
  if (in_RSI == 0) {
    dbg_msg("engine","failed to start logging network sent packages");
  }
  else {
    *(long *)(in_RDI + 0x158) = in_RSI;
    dbg_msg("engine","logging network sent packages");
  }
  if (in_RDX == 0) {
    dbg_msg("engine","failed to start logging network recv packages");
  }
  else {
    *(long *)(in_RDI + 0x160) = in_RDX;
    dbg_msg("engine","logging network recv packages");
  }
  *(undefined1 *)(in_RDI + 0x150) = 1;
  return;
}

Assistant:

void StartLogging(IOHANDLE DataLogSent, IOHANDLE DataLogRecv)
	{
		if(DataLogSent)
		{
			m_DataLogSent = DataLogSent;
			dbg_msg("engine", "logging network sent packages");
		}
		else
			dbg_msg("engine", "failed to start logging network sent packages");

		if(DataLogRecv)
		{
			m_DataLogRecv = DataLogRecv;
			dbg_msg("engine", "logging network recv packages");
		}
		else
			dbg_msg("engine", "failed to start logging network recv packages");

		m_Logging = true;
	}